

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

void __thiscall xe::TestResultParser::clear(TestResultParser *this)

{
  pointer ppIVar1;
  
  xml::Parser::clear(&this->m_xmlParser);
  ppIVar1 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar1) {
    (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar1;
  }
  this->m_result = (TestCaseResult *)0x0;
  this->m_state = STATE_NOT_INITIALIZED;
  this->m_logVersion = TESTLOGVERSION_LAST;
  this->m_curItemList = (List *)0x0;
  this->m_base64DecodeOffset = 0;
  (this->m_curNumValue)._M_string_length = 0;
  *(this->m_curNumValue)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void TestResultParser::clear (void)
{
	m_xmlParser.clear();
	m_itemStack.clear();

	m_result				= DE_NULL;
	m_state					= STATE_NOT_INITIALIZED;
	m_logVersion			= TESTLOGVERSION_LAST;
	m_curItemList			= DE_NULL;
	m_base64DecodeOffset	= 0;
	m_curNumValue.clear();
}